

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O1

int mbedtls_cipher_check_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uchar check_tag [16];
  size_t output_length;
  uchar auStack_38 [16];
  size_t local_28;
  
  if ((ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) || (ctx->operation != MBEDTLS_DECRYPT)) {
    return -0x6100;
  }
  iVar3 = -0x6080;
  if ((*(uint *)&ctx->cipher_info->field_0x8 & 0xf000) == 0x6000) {
    bVar1 = true;
    if (tag_len < 0x11) {
      iVar2 = mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,(uchar *)0x0,0,&local_28,
                                 auStack_38,tag_len);
      iVar3 = iVar2;
      if (iVar2 == 0) {
        iVar2 = mbedtls_ct_memcmp(tag,auStack_38,tag_len);
        iVar3 = -0x6300;
        if (iVar2 == 0) {
          iVar3 = 0;
        }
        bVar1 = false;
      }
    }
    else {
      iVar2 = -0x6100;
    }
    if (bVar1) {
      return iVar2;
    }
  }
  mbedtls_platform_zeroize(auStack_38,tag_len);
  return iVar3;
}

Assistant:

int mbedtls_cipher_check_tag(mbedtls_cipher_context_t *ctx,
                             const unsigned char *tag, size_t tag_len)
{
    unsigned char check_tag[16];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (ctx->cipher_info == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    if (MBEDTLS_DECRYPT != ctx->operation) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO) && !defined(MBEDTLS_DEPRECATED_REMOVED)
    if (ctx->psa_enabled == 1) {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO && !MBEDTLS_DEPRECATED_REMOVED */

    /* Status to return on a non-authenticated algorithm. */
    ret = MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;

#if defined(MBEDTLS_GCM_C)
    if (MBEDTLS_MODE_GCM == ((mbedtls_cipher_mode_t) ctx->cipher_info->mode)) {
        size_t output_length;
        /* The code here doesn't yet support alternative implementations
         * that can delay up to a block of output. */

        if (tag_len > sizeof(check_tag)) {
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
        }

        if (0 != (ret = mbedtls_gcm_finish(
                      (mbedtls_gcm_context *) ctx->cipher_ctx,
                      NULL, 0, &output_length,
                      check_tag, tag_len))) {
            return ret;
        }

        /* Check the tag in "constant-time" */
        if (mbedtls_ct_memcmp(tag, check_tag, tag_len) != 0) {
            ret = MBEDTLS_ERR_CIPHER_AUTH_FAILED;
            goto exit;
        }
    }
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
    if (MBEDTLS_CIPHER_CHACHA20_POLY1305 == ((mbedtls_cipher_type_t) ctx->cipher_info->type)) {
        /* Don't allow truncated MAC for Poly1305 */
        if (tag_len != sizeof(check_tag)) {
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
        }

        ret = mbedtls_chachapoly_finish(
            (mbedtls_chachapoly_context *) ctx->cipher_ctx, check_tag);
        if (ret != 0) {
            return ret;
        }

        /* Check the tag in "constant-time" */
        if (mbedtls_ct_memcmp(tag, check_tag, tag_len) != 0) {
            ret = MBEDTLS_ERR_CIPHER_AUTH_FAILED;
            goto exit;
        }
    }
#endif /* MBEDTLS_CHACHAPOLY_C */

exit:
    mbedtls_platform_zeroize(check_tag, tag_len);
    return ret;
}